

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::MultiPartInputFile::Data::Data
          (Data *this,bool deleteStream,int numThreads,bool reconstructChunkOffsetTable)

{
  byte in_CL;
  undefined4 in_EDX;
  byte in_SIL;
  InputStreamMutex *in_RDI;
  
  InputStreamMutex::InputStreamMutex(in_RDI);
  in_RDI[1].super_Mutex.super___mutex_base._M_mutex.__size[4] = in_SIL & 1;
  std::vector<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>::vector
            ((vector<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_> *)0xabf245
            );
  *(undefined4 *)((long)&in_RDI[1].super_Mutex.super___mutex_base._M_mutex + 0x20) = in_EDX;
  in_RDI[1].super_Mutex.super___mutex_base._M_mutex.__size[0x24] = in_CL & 1;
  std::
  map<int,_Imf_2_5::GenericInputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_2_5::GenericInputFile_*>_>_>
  ::map((map<int,_Imf_2_5::GenericInputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_2_5::GenericInputFile_*>_>_>
         *)0xabf263);
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::vector
            ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)0xabf274);
  return;
}

Assistant:

Data (bool deleteStream, int numThreads, bool reconstructChunkOffsetTable):
        InputStreamMutex(),
        deleteStream (deleteStream),
        numThreads (numThreads),
        reconstructChunkOffsetTable(reconstructChunkOffsetTable)
    {
    }